

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

unsigned_long
AdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,int processPartialUserBuffers)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  void **ppvVar4;
  PaStreamCallbackTimeInfo *pPVar5;
  int iVar6;
  void ***pppvVar7;
  uint uVar8;
  unsigned_long *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  PaUtilChannelDescriptor *pPVar16;
  void *pvVar17;
  unsigned_long uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  double dVar21;
  ulong local_80;
  unsigned_long local_78;
  
  if (processPartialUserBuffers == 0) {
    local_80 = bp->framesPerUserBuffer - 1;
  }
  else {
    local_80 = 0;
  }
  puVar1 = bp->hostInputFrameCount;
  puVar2 = bp->hostInputFrameCount + 1;
  uVar15 = bp->hostInputFrameCount[1] + bp->hostInputFrameCount[0];
  CopyTempOutputBuffersToHostOutputBuffers(bp);
  local_78 = 0;
  do {
    if (uVar15 <= local_80) {
      return local_78;
    }
    if ((bp->framesInTempOutputBuffer == 0) && (*streamCallbackResult != 0)) {
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        uVar14 = (uint)bp->hostOutputFrameCount[lVar10];
        if (uVar14 != 0) {
          pPVar16 = bp->hostOutputChannels[lVar10];
          for (uVar19 = 0; uVar19 < bp->outputChannelCount; uVar19 = uVar19 + 1) {
            (*bp->outputZeroer)(pPVar16->data,pPVar16->stride,uVar14);
            pPVar16->data =
                 (void *)((long)pPVar16->data +
                         (ulong)(pPVar16->stride * uVar14 * bp->bytesPerHostOutputSample));
            pPVar16 = pPVar16 + 1;
          }
          bp->hostOutputFrameCount[lVar10] = 0;
        }
      }
    }
    uVar18 = bp->framesInTempInputBuffer;
    while( true ) {
      uVar19 = bp->framesPerUserBuffer;
      uVar11 = uVar19 - uVar18;
      if (uVar19 < uVar18 || uVar11 == 0) break;
      uVar3 = *puVar1;
      if (uVar3 + *puVar2 == 0) break;
      uVar12 = *puVar2;
      if (uVar3 != 0) {
        uVar12 = uVar3;
      }
      if (uVar11 <= uVar12) {
        uVar12 = uVar11;
      }
      uVar14 = bp->bytesPerUserInputSample;
      if (bp->userInputIsInterleaved == 0) {
        uVar8 = (int)uVar19 * uVar14;
        uVar13 = 1;
      }
      else {
        uVar13 = bp->inputChannelCount;
        uVar8 = uVar14;
        uVar14 = uVar13 * uVar14;
      }
      pPVar16 = bp->hostInputChannels[uVar3 == 0];
      pvVar17 = (void *)(uVar18 * uVar14 + (long)bp->tempInputBuffer);
      for (uVar19 = 0; uVar19 < bp->inputChannelCount; uVar19 = uVar19 + 1) {
        (*bp->inputConverter)
                  (pvVar17,uVar13,pPVar16->data,pPVar16->stride,(uint)uVar12,&bp->ditherGenerator);
        pPVar16->data =
             (void *)((long)pPVar16->data +
                     (ulong)(pPVar16->stride * (uint)uVar12 * bp->bytesPerHostInputSample));
        pvVar17 = (void *)((long)pvVar17 + (ulong)uVar8);
        pPVar16 = pPVar16 + 1;
      }
      uVar19 = *puVar1;
      puVar9 = puVar1;
      if (uVar19 == 0) {
        uVar19 = *puVar2;
        puVar9 = puVar2;
      }
      uVar12 = uVar12 & 0xffffffff;
      *puVar9 = uVar19 - uVar12;
      uVar18 = bp->framesInTempInputBuffer + uVar12;
      bp->framesInTempInputBuffer = uVar18;
      uVar15 = uVar15 - uVar12;
      local_78 = local_78 + uVar12;
    }
    if ((uVar19 == uVar18) && (bp->framesInTempOutputBuffer == 0)) {
      if (*streamCallbackResult == 0) {
        pppvVar7 = (void ***)&bp->tempInputBuffer;
        if (bp->userInputIsInterleaved == 0) {
          uVar14 = bp->inputChannelCount;
          lVar10 = 0;
          for (uVar19 = 0; pppvVar7 = &bp->tempInputBufferPtrs, uVar14 != uVar19;
              uVar19 = uVar19 + 1) {
            bp->tempInputBufferPtrs[uVar19] =
                 (void *)((ulong)bp->bytesPerUserInputSample * lVar10 + (long)bp->tempInputBuffer);
            lVar10 = lVar10 + uVar18;
          }
        }
        ppvVar4 = *pppvVar7;
        pppvVar7 = (void ***)&bp->tempOutputBuffer;
        if (bp->userOutputIsInterleaved == 0) {
          uVar14 = bp->outputChannelCount;
          lVar10 = 0;
          for (uVar19 = 0; pppvVar7 = &bp->tempOutputBufferPtrs, uVar14 != uVar19;
              uVar19 = uVar19 + 1) {
            bp->tempOutputBufferPtrs[uVar19] =
                 (void *)((ulong)bp->bytesPerUserOutputSample * lVar10 + (long)bp->tempOutputBuffer)
            ;
            lVar10 = lVar10 + uVar18;
          }
        }
        iVar6 = (*bp->streamCallback)
                          (ppvVar4,*pppvVar7,uVar18,bp->timeInfo,bp->callbackStatusFlags,
                           bp->userData);
        *streamCallbackResult = iVar6;
        uVar18 = bp->framesPerUserBuffer;
        pPVar5 = bp->timeInfo;
        auVar20._8_4_ = (int)(uVar18 >> 0x20);
        auVar20._0_8_ = uVar18;
        auVar20._12_4_ = 0x45300000;
        dVar21 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) * bp->samplePeriod
        ;
        pPVar5->inputBufferAdcTime = pPVar5->inputBufferAdcTime + dVar21;
        pPVar5->outputBufferDacTime = dVar21 + pPVar5->outputBufferDacTime;
        bp->framesInTempInputBuffer = 0;
        if (iVar6 == 2) {
          bp->framesInTempOutputBuffer = 0;
        }
        else {
          bp->framesInTempOutputBuffer = uVar18;
        }
      }
      else {
        bp->framesInTempInputBuffer = 0;
      }
    }
    CopyTempOutputBuffersToHostOutputBuffers(bp);
  } while( true );
}

Assistant:

static unsigned long AdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult, int processPartialUserBuffers )
{
    void *userInput, *userOutput;
    unsigned long framesProcessed = 0;
    unsigned long framesAvailable;
    unsigned long endProcessingMinFrameCount;
    unsigned long maxFramesToCopy;
    PaUtilChannelDescriptor *hostInputChannels, *hostOutputChannels;
    unsigned int frameCount;
    unsigned char *destBytePtr;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i, j;


    framesAvailable = bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1];/* this is assumed to be the same as the output buffer's frame count */

    if( processPartialUserBuffers )
        endProcessingMinFrameCount = 0;
    else
        endProcessingMinFrameCount = (bp->framesPerUserBuffer - 1);

    /* Fill host output with remaining frames in user output (tempOutputBuffer) */
    CopyTempOutputBuffersToHostOutputBuffers( bp );

    while( framesAvailable > endProcessingMinFrameCount )
    {

        if( bp->framesInTempOutputBuffer == 0 && *streamCallbackResult != paContinue )
        {
            /* the callback will not be called any more, so zero what remains
                of the host output buffers */

            for( i=0; i<2; ++i )
            {
                frameCount = bp->hostOutputFrameCount[i];
                if( frameCount > 0 )
                {
                    hostOutputChannels = bp->hostOutputChannels[i];

                    for( j=0; j<bp->outputChannelCount; ++j )
                    {
                        bp->outputZeroer(   hostOutputChannels[j].data,
                                            hostOutputChannels[j].stride,
                                            frameCount );

                        /* advance dest ptr for next iteration  */
                        hostOutputChannels[j].data = ((unsigned char*)hostOutputChannels[j].data) +
                                frameCount * hostOutputChannels[j].stride * bp->bytesPerHostOutputSample;
                    }
                    bp->hostOutputFrameCount[i] = 0;
                }
            }
        }


        /* copy frames from host to user input buffers */
        while( bp->framesInTempInputBuffer < bp->framesPerUserBuffer &&
                ((bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) > 0) )
        {
            maxFramesToCopy = bp->framesPerUserBuffer - bp->framesInTempInputBuffer;

            /* select the input buffer set (1st or 2nd) */
            if( bp->hostInputFrameCount[0] > 0 )
            {
                hostInputChannels = bp->hostInputChannels[0];
                frameCount = PA_MIN_( bp->hostInputFrameCount[0], maxFramesToCopy );
            }
            else
            {
                hostInputChannels = bp->hostInputChannels[1];
                frameCount = PA_MIN_( bp->hostInputFrameCount[1], maxFramesToCopy );
            }

            /* configure conversion destination pointers */
            if( bp->userInputIsInterleaved )
            {
                destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                        bp->bytesPerUserInputSample * bp->inputChannelCount *
                        bp->framesInTempInputBuffer;

                destSampleStrideSamples = bp->inputChannelCount;
                destChannelStrideBytes = bp->bytesPerUserInputSample;
            }
            else /* user input is not interleaved */
            {
                destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                        bp->bytesPerUserInputSample * bp->framesInTempInputBuffer;

                destSampleStrideSamples = 1;
                destChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
            }

            for( i=0; i<bp->inputChannelCount; ++i )
            {
                bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                        hostInputChannels[i].data,
                                        hostInputChannels[i].stride,
                                        frameCount, &bp->ditherGenerator );

                destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                /* advance src ptr for next iteration */
                hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                        frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
            }

            if( bp->hostInputFrameCount[0] > 0 )
                bp->hostInputFrameCount[0] -= frameCount;
            else
                bp->hostInputFrameCount[1] -= frameCount;

            bp->framesInTempInputBuffer += frameCount;

            /* update framesAvailable and framesProcessed based on input consumed
                unless something is very wrong this will also correspond to the
                amount of output generated */
            framesAvailable -= frameCount;
            framesProcessed += frameCount;
        }

        /* call streamCallback */
        if( bp->framesInTempInputBuffer == bp->framesPerUserBuffer &&
            bp->framesInTempOutputBuffer == 0 )
        {
            if( *streamCallbackResult == paContinue )
            {
                /* setup userInput */
                if( bp->userInputIsInterleaved )
                {
                    userInput = bp->tempInputBuffer;
                }
                else /* user input is not interleaved */
                {
                    for( i = 0; i < bp->inputChannelCount; ++i )
                    {
                        bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                                i * bp->framesPerUserBuffer * bp->bytesPerUserInputSample;
                    }

                    userInput = bp->tempInputBufferPtrs;
                }

                /* setup userOutput */
                if( bp->userOutputIsInterleaved )
                {
                    userOutput = bp->tempOutputBuffer;
                }
                else /* user output is not interleaved */
                {
                    for( i = 0; i < bp->outputChannelCount; ++i )
                    {
                        bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                                i * bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }

                /* call streamCallback */

                *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                        bp->framesPerUserBuffer, bp->timeInfo,
                        bp->callbackStatusFlags, bp->userData );

                bp->timeInfo->inputBufferAdcTime += bp->framesPerUserBuffer * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += bp->framesPerUserBuffer * bp->samplePeriod;

                bp->framesInTempInputBuffer = 0;

                if( *streamCallbackResult == paAbort )
                    bp->framesInTempOutputBuffer = 0;
                else
                    bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
            }
            else
            {
                /* paComplete or paAbort has already been called. */

                bp->framesInTempInputBuffer = 0;
            }
        }

        /* copy frames from user (tempOutputBuffer) to host output buffers (hostOutputChannels)
           Means to process the user output provided by the callback. Has to be called after
            each callback. */
        CopyTempOutputBuffersToHostOutputBuffers( bp );

    }

    return framesProcessed;
}